

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update_extensions.hpp
# Opt level: O1

void __thiscall
duckdb::PhysicalUpdateExtensions::PhysicalUpdateExtensions
          (PhysicalUpdateExtensions *this,
          unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
          *info,idx_t estimated_cardinality)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b9;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b8;
  LogicalType local_a0 [4];
  LogicalType local_40;
  
  LogicalType::LogicalType(local_a0,VARCHAR);
  LogicalType::LogicalType(local_a0 + 1,VARCHAR);
  LogicalType::LogicalType(local_a0 + 2,VARCHAR);
  LogicalType::LogicalType(local_a0 + 3,VARCHAR);
  LogicalType::LogicalType(&local_40,VARCHAR);
  __l._M_len = 5;
  __l._M_array = local_a0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_b8,__l,&local_b9);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_0199fae8;
  (this->super_PhysicalOperator).type = UPDATE_EXTENSIONS;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).estimated_cardinality = estimated_cardinality;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_b8);
  lVar1 = 0x60;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalUpdateExtensions_019c27d0;
  (this->info).
  super_unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl =
       (info->
       super_unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
       .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl;
  (info->
  super_unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl =
       (UpdateExtensionsInfo *)0x0;
  return;
}

Assistant:

explicit PhysicalUpdateExtensions(unique_ptr<UpdateExtensionsInfo> info, idx_t estimated_cardinality)
	    : PhysicalOperator(PhysicalOperatorType::UPDATE_EXTENSIONS,
	                       {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR,
	                        LogicalType::VARCHAR},
	                       estimated_cardinality),
	      info(std::move(info)) {
	}